

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

void mpc_cleanup(int n,...)

{
  mpc_parser_t *p;
  ulong uVar1;
  char in_AL;
  void *__ptr;
  undefined8 in_RCX;
  undefined8 in_RDX;
  ulong uVar2;
  undefined8 in_RSI;
  void **ppvVar3;
  ulong uVar4;
  void **ppvVar5;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  uint local_f8;
  void *local_d8 [4];
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  uVar1 = (ulong)(uint)n;
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_d8[1] = (void *)in_RSI;
  local_d8[2] = (void *)in_RDX;
  local_d8[3] = (void *)in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  __ptr = malloc((long)n * 8);
  ppvVar3 = &va[0].overflow_arg_area;
  if (0 < n) {
    local_f8 = 8;
    uVar2 = 0;
    do {
      if (local_f8 < 0x29) {
        uVar4 = (ulong)local_f8;
        local_f8 = local_f8 + 8;
        ppvVar5 = (void **)((long)local_d8 + uVar4);
      }
      else {
        ppvVar5 = ppvVar3;
        ppvVar3 = ppvVar3 + 1;
      }
      *(void **)((long)__ptr + uVar2 * 8) = *ppvVar5;
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
    if (0 < n) {
      uVar2 = 0;
      do {
        p = *(mpc_parser_t **)((long)__ptr + uVar2 * 8);
        mpc_undefine_unretained(p,1);
        p->type = '\0';
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
      if (0 < n) {
        uVar2 = 0;
        do {
          mpc_delete(*(mpc_parser_t **)((long)__ptr + uVar2 * 8));
          uVar2 = uVar2 + 1;
        } while (uVar1 != uVar2);
      }
    }
  }
  free(__ptr);
  return;
}

Assistant:

void mpc_cleanup(int n, ...) {
  int i;
  mpc_parser_t **list = malloc(sizeof(mpc_parser_t*) * n);

  va_list va;
  va_start(va, n);
  for (i = 0; i < n; i++) { list[i] = va_arg(va, mpc_parser_t*); }
  for (i = 0; i < n; i++) { mpc_undefine(list[i]); }
  for (i = 0; i < n; i++) { mpc_delete(list[i]); }
  va_end(va);

  free(list);
}